

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesGroupInfo::serialize(XercesGroupInfo *this,XSerializeEngine *serEng)

{
  ContentSpecNode *pCVar1;
  XercesGroupInfo *pXVar2;
  size_t in_RCX;
  XSerializeEngine *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fCheckElementConsistency);
    XSerializeEngine::operator>>(serEng,&this->fScope);
    XSerializeEngine::operator>>(serEng,&this->fNameId);
    XSerializeEngine::operator>>(serEng,&this->fNamespaceId);
    pCVar1 = (ContentSpecNode *)XSerializeEngine::read(serEng,0x438768,__buf,in_RCX);
    this->fContentSpec = pCVar1;
    __nbytes = serEng;
    XTemplateSerializer::loadObject(&this->fElements,4,false,serEng);
    pXVar2 = (XercesGroupInfo *)XSerializeEngine::read(serEng,0x439af0,__buf_00,(size_t)__nbytes);
    this->fBaseGroup = pXVar2;
    this->fLocator = (XSDLocator *)0x0;
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fCheckElementConsistency);
  XSerializeEngine::operator<<(serEng,this->fScope);
  XSerializeEngine::operator<<(serEng,this->fNameId);
  XSerializeEngine::operator<<(serEng,this->fNamespaceId);
  XSerializeEngine::write(serEng,(int)this->fContentSpec,__buf_01,in_RCX);
  XTemplateSerializer::storeObject(this->fElements,serEng);
  XSerializeEngine::write(serEng,(int)this->fBaseGroup,__buf_02,in_RCX);
  return;
}

Assistant:

void XercesGroupInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fCheckElementConsistency;
        serEng<<fScope;
        serEng<<fNameId;
        serEng<<fNamespaceId;
        serEng<<fContentSpec;

        /***
         *
         * Serialize RefVectorOf<SchemaElementDecl>* fElements;
         *
         ***/

        XTemplateSerializer::storeObject(fElements, serEng);

        serEng<<fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
    }
    else
    {
        serEng>>fCheckElementConsistency;
        serEng>>fScope;
        serEng>>fNameId;
        serEng>>fNamespaceId;
        serEng>>fContentSpec;

        /***
         * 
         * Deserialize RefVectorOf<SchemaElementDecl>*    fElements;
         *
         ***/
        XTemplateSerializer::loadObject(&fElements, 4, false, serEng);

        serEng>>fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
        fLocator = 0;
    }

}